

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O1

void __thiscall SynthWidget::on_audioRecord_clicked(SynthWidget *this)

{
  QPushButton *pQVar1;
  int *piVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  undefined4 uVar7;
  int iVar8;
  Master *this_00;
  QSettings *pQVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QString fileName;
  QArrayData *local_98;
  char16_t *pcStack_90;
  long local_88;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  
  bVar6 = SynthRoute::isRecordingAudio(this->synthRoute);
  if (bVar6) {
    pQVar1 = (this->ui->super_Ui_SynthWidget).audioRecord;
    QVar10.m_data = (storage_type *)0x6;
    QVar10.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar10);
    local_78.shared = local_58.shared;
    local_78._8_8_ = local_58._8_8_;
    local_78._16_8_ = local_58._16_8_;
    QAbstractButton::setText((QString *)pQVar1);
    if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
      }
    }
    SynthRoute::stopRecordingAudio(this->synthRoute);
  }
  else {
    if (on_audioRecord_clicked()::currentDir == '\0') {
      iVar8 = __cxa_guard_acquire(&on_audioRecord_clicked()::currentDir);
      if (iVar8 != 0) {
        QString::QString(&on_audioRecord_clicked::currentDir,(char *)0x0);
        __cxa_atexit(QString::~QString,&on_audioRecord_clicked::currentDir,&__dso_handle);
        __cxa_guard_release(&on_audioRecord_clicked()::currentDir);
      }
    }
    this_00 = Master::getInstance();
    pQVar9 = Master::getSettings(this_00);
    QVar11.m_data = (storage_type *)0x19;
    QVar11.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar11);
    local_98 = (QArrayData *)local_78.shared;
    pcStack_90 = (char16_t *)local_78._8_8_;
    local_88 = local_78._16_8_;
    QVariant::QVariant((QVariant *)&local_78,0);
    QSettings::value((QString *)local_58.data,(QVariant *)pQVar9);
    uVar7 = QVariant::toInt((bool *)local_58.data);
    QVariant::~QVariant((QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_78);
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
    QVar12.m_data = (storage_type *)0x0;
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    local_98 = (QArrayData *)local_58.shared;
    pcStack_90 = (char16_t *)local_58._8_8_;
    local_88 = local_58._16_8_;
    QVar13.m_data = (storage_type *)0x1e;
    QVar13.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar13);
    local_38 = local_58._0_4_;
    uStack_34 = local_58._4_4_;
    uStack_30 = local_58._8_4_;
    uStack_2c = local_58._12_4_;
    local_28 = local_58._16_8_;
    QFileDialog::getSaveFileName
              (&local_78,this,&local_98,&on_audioRecord_clicked::currentDir,&local_38,0,uVar7);
    piVar2 = (int *)CONCAT44(uStack_34,local_38);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_34,local_38),2,8);
      }
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
    if (local_78._16_8_ != 0) {
      QDir::QDir((QDir *)&local_98,(QString *)local_78.data);
      QDir::absolutePath();
      qVar5 = on_audioRecord_clicked::currentDir.d.size;
      pcVar4 = on_audioRecord_clicked::currentDir.d.ptr;
      pDVar3 = on_audioRecord_clicked::currentDir.d.d;
      on_audioRecord_clicked::currentDir.d.d = (Data *)local_58.shared;
      local_58.shared = (PrivateShared *)pDVar3;
      on_audioRecord_clicked::currentDir.d.ptr = (char16_t *)local_58._8_8_;
      on_audioRecord_clicked::currentDir.d.size = local_58._16_8_;
      local_58._8_8_ = pcVar4;
      local_58._16_8_ = qVar5;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,8);
        }
      }
      QDir::~QDir((QDir *)&local_98);
      pQVar1 = (this->ui->super_Ui_SynthWidget).audioRecord;
      QVar14.m_data = (storage_type *)0x4;
      QVar14.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar14);
      local_98 = (QArrayData *)local_58.shared;
      pcStack_90 = (char16_t *)local_58._8_8_;
      local_88 = local_58._16_8_;
      QAbstractButton::setText((QString *)pQVar1);
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,2,8);
        }
      }
      SynthRoute::startRecordingAudio(this->synthRoute,(QString *)&local_78);
    }
    if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
      }
    }
  }
  return;
}

Assistant:

void SynthWidget::on_audioRecord_clicked() {
	if (synthRoute->isRecordingAudio()) {
		ui->audioRecord->setText("Record");
		synthRoute->stopRecordingAudio();
	} else {
		static QString currentDir = NULL;
		QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
		QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "*.wav *.raw;;*.wav;;*.raw;;*.*",
			NULL, qFileDialogOptions);
		if (!fileName.isEmpty()) {
			currentDir = QDir(fileName).absolutePath();
			ui->audioRecord->setText("Stop");
			synthRoute->startRecordingAudio(fileName);
		}
	}
}